

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::make_constant_null(Compiler *this,uint32_t id,uint32_t type)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  uint32_t uVar5;
  SPIRType *pSVar6;
  SPIRConstant *pSVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  SmallVector<unsigned_int,_8UL> elements;
  undefined1 auStack_158 [8];
  undefined1 *puStack_150;
  undefined1 auStack_148 [11];
  bool local_13d;
  uint32_t local_13c;
  uint32_t local_138;
  uint local_134;
  AlignedBuffer<unsigned_int,_8UL> *local_130;
  SmallVector<unsigned_int,_8UL> local_128 [4];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  puStack_150 = (undefined1 *)0x330a12;
  local_13c = type;
  pSVar6 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + type);
  if (pSVar6->pointer == true) {
    puStack_150 = (undefined1 *)0x330a2f;
    pSVar7 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>(this,id,&local_13c);
    puStack_150 = (undefined1 *)0x330a43;
    memset(local_128,0,0xf8);
    lVar8 = 0x30;
    do {
      *(undefined1 (*) [16])((long)&local_138 + lVar8) = (undefined1  [16])0x0;
      pcVar1 = local_128[0].stack_storage.aligned_char + lVar8 + -0x18;
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      *(undefined1 (*) [16])(auStack_158 + lVar8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(auStack_148 + lVar8) = (undefined1  [16])0x0;
      lVar8 = lVar8 + 0x38;
    } while (lVar8 != 0x110);
    local_48 = (undefined1  [16])0x0;
    local_38 = 1;
    puStack_150 = (undefined1 *)0x330a9d;
    memcpy(&pSVar7->m,local_128,0xf4);
    (pSVar7->m).columns = pSVar6->columns;
    uVar5 = pSVar6->vecsize;
    lVar8 = -0xe0;
    do {
      *(uint32_t *)((pSVar7->subconstants).stack_storage.aligned_char + lVar8 + -8) = uVar5;
      lVar8 = lVar8 + 0x38;
    } while (lVar8 != 0);
    return;
  }
  if ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    sVar3 = (pSVar6->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size;
    if (sVar3 == 0) {
      puStack_150 = (undefined1 *)0x330d4b;
      pSVar7 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>(this,id,&local_13c);
      puStack_150 = (undefined1 *)0x330d5f;
      memset(local_128,0,0xf8);
      lVar8 = 0x30;
      do {
        *(undefined1 (*) [16])((long)&local_138 + lVar8) = (undefined1  [16])0x0;
        pcVar1 = local_128[0].stack_storage.aligned_char + lVar8 + -0x18;
        pcVar1[0] = '\x01';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        *(undefined1 (*) [16])(auStack_158 + lVar8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(auStack_148 + lVar8) = (undefined1  [16])0x0;
        lVar8 = lVar8 + 0x38;
      } while (lVar8 != 0x110);
      local_48 = (undefined1  [16])0x0;
      local_38 = 1;
      puStack_150 = (undefined1 *)0x330db9;
      memcpy(&pSVar7->m,local_128,0xf4);
      (pSVar7->m).columns = pSVar6->columns;
      uVar5 = pSVar6->vecsize;
      lVar8 = -0xe0;
      do {
        *(uint32_t *)((pSVar7->subconstants).stack_storage.aligned_char + lVar8 + -8) = uVar5;
        lVar8 = lVar8 + 0x38;
      } while (lVar8 != 0);
      return;
    }
    puStack_150 = (undefined1 *)0x330cc3;
    local_138 = id;
    uVar5 = ParsedIR::increase_bound_by(&this->ir,(uint32_t)sVar3);
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    local_128[0].buffer_capacity = 8;
    puStack_150 = (undefined1 *)0x330cf2;
    local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
    SmallVector<unsigned_int,_8UL>::resize
              (local_128,
               (pSVar6->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
               buffer_size);
    if ((pSVar6->member_types).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size
        != 0) {
      uVar10 = 1;
      uVar11 = 0;
      do {
        puStack_150 = (undefined1 *)0x330d1d;
        make_constant_null(this,uVar5,
                           (pSVar6->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           .ptr[uVar11].id);
        *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar11 * 4) = uVar5;
        uVar11 = (ulong)uVar10;
        uVar5 = uVar5 + 1;
        uVar10 = uVar10 + 1;
      } while (uVar11 < (pSVar6->member_types).
                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                        .buffer_size);
    }
    local_130 = (AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr;
    local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
    local_13d = false;
    puStack_150 = (undefined1 *)0x330e10;
    set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
              (this,local_138,&local_13c,(uint **)&local_130,&local_134,&local_13d);
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr ==
        &local_128[0].stack_storage) {
      return;
    }
  }
  else {
    if ((pSVar6->parent_type).id == 0) {
      puStack_150 = &LAB_00330e59;
      __assert_fail("constant_type.parent_type",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                    ,0x132e,
                    "void diligent_spirv_cross::Compiler::make_constant_null(uint32_t, uint32_t)");
    }
    uVar10 = 1;
    puStack_150 = (undefined1 *)0x330af0;
    uVar5 = ParsedIR::increase_bound_by(&this->ir,1);
    puStack_150 = (undefined1 *)0x330b03;
    make_constant_null(this,uVar5,(pSVar6->parent_type).id);
    bVar2 = (pSVar6->array_size_literal).super_VectorView<bool>.ptr
            [(pSVar6->array_size_literal).super_VectorView<bool>.buffer_size - 1];
    local_138 = CONCAT31(local_138._1_3_,bVar2);
    if (bVar2 == true) {
      uVar10 = (pSVar6->array).super_VectorView<unsigned_int>.ptr
               [(pSVar6->array).super_VectorView<unsigned_int>.buffer_size - 1];
    }
    uVar11 = (ulong)uVar10;
    local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    local_128[0].buffer_capacity = 8;
    puStack_150 = (undefined1 *)0x330b4f;
    SmallVector<unsigned_int,_8UL>::resize(local_128,uVar11);
    auVar4 = _DAT_006a3b30;
    if (uVar10 != 0) {
      lVar8 = uVar11 - 1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar9 = 0;
      auVar12 = auVar12 ^ _DAT_006a3b30;
      auVar14 = _DAT_006b0840;
      auVar15 = _DAT_006b0850;
      do {
        auVar16 = auVar15 ^ auVar4;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                    iVar13 < auVar16._4_4_) & 1)) {
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar9) = uVar5;
        }
        if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
            auVar16._12_4_ <= auVar12._12_4_) {
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar9 + 4) = uVar5
          ;
        }
        auVar16 = auVar14 ^ auVar4;
        iVar17 = auVar16._4_4_;
        if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar9 + 8) = uVar5
          ;
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar9 + 0xc) =
               uVar5;
        }
        lVar8 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar8 + 4;
        lVar8 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar8 + 4;
        uVar9 = uVar9 + 0x10;
      } while ((uVar11 * 4 + 0xc & 0xfffffffffffffff0) != uVar9);
    }
    local_130 = (AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr;
    local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
    local_13d = false;
    puStack_150 = (undefined1 *)0x330c77;
    pSVar7 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                       (this,id,&local_13c,(uint **)&local_130,&local_134,&local_13d);
    pSVar7->is_null_array_specialized_length = (bool)((byte)local_138 ^ 1);
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr ==
        &local_128[0].stack_storage) {
      return;
    }
  }
  local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
  puStack_150 = (undefined1 *)0x330e28;
  free(local_128[0].super_VectorView<unsigned_int>.ptr);
  return;
}

Assistant:

void Compiler::make_constant_null(uint32_t id, uint32_t type)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = ir.increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;
		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;
		auto &constant = set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = ir.increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i]);
			elements[i] = member_ids + i;
		}
		set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
	}
	else
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
}